

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgRuleWavelet.cpp
# Opt level: O3

double __thiscall TasGrid::RuleWavelet::eval_cubic<0>(RuleWavelet *this,int point,double x)

{
  double *pdVar1;
  double *pdVar2;
  pointer pvVar3;
  pointer pdVar4;
  ulong uVar5;
  uint uVar6;
  long lVar7;
  long lVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  
  dVar16 = x;
  if (point < 5) {
    if (point == 4) {
      dVar16 = -x;
      point = 3;
    }
    else if (point == 2) {
      dVar16 = -x;
      point = 1;
    }
    if (1.0 < ABS(dVar16)) {
      return 0.0;
    }
    pvVar3 = (this->data).
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    iVar9 = this->num_data_points;
    lVar7 = (long)(((point - (point + 1 >> 0x1f)) + 1 >> 1) * iVar9) * 8 +
            *(long *)&pvVar3[1].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data;
    lVar8 = *(long *)&(pvVar3->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                      super__Vector_impl_data;
    uVar5 = 0;
    if (iVar9 < 3) goto LAB_001c51c7;
    uVar6 = iVar9 - 1;
    do {
      uVar11 = (int)((int)uVar5 + uVar6) / 2;
      if (*(double *)(lVar8 + (long)(int)uVar11 * 8) <= dVar16) {
        uVar5 = (ulong)uVar11;
        uVar11 = uVar6;
      }
      uVar6 = uVar11;
      iVar14 = (int)uVar5;
    } while (1 < (int)(uVar6 - iVar14));
    goto LAB_001c4e39;
  }
  uVar6 = point - 1U;
  iVar9 = -4;
  do {
    iVar14 = iVar9;
    uVar6 = (int)uVar6 >> 1;
    iVar9 = iVar14 + 1;
  } while (1 < uVar6);
  iVar14 = iVar14 + 4;
  if (iVar14 == 2) {
    if (0xc < point) {
      point = 0x19 - point;
      dVar16 = -x;
    }
    if (1.0 < ABS(x)) {
      return 0.0;
    }
    pvVar3 = (this->data).
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    iVar9 = this->num_data_points;
    lVar7 = (long)((point + -9) * iVar9) * 8 +
            *(long *)&pvVar3[3].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data;
    lVar8 = *(long *)&(pvVar3->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                      super__Vector_impl_data;
    iVar14 = 0;
    uVar5 = 0;
    if (iVar9 < 3) goto LAB_001c51c7;
    iVar10 = iVar9 + -1;
    do {
      iVar12 = (iVar14 + iVar10) / 2;
      if (*(double *)(lVar8 + (long)iVar12 * 8) <= dVar16) {
        iVar14 = iVar12;
        iVar12 = iVar10;
      }
      iVar10 = iVar12;
    } while (1 < iVar10 - iVar14);
LAB_001c503f:
    if (iVar14 == -1) {
      return 0.0;
    }
    if (0 < iVar14) {
      iVar10 = iVar9 + -3;
      if (iVar14 - iVar9 < -2) {
        iVar10 = iVar14;
      }
      uVar5 = (ulong)(iVar10 + -1);
      goto LAB_001c51c7;
    }
  }
  else {
    if (iVar14 == 1) {
      if (6 < point) {
        point = 0xd - point;
        dVar16 = -x;
      }
      if (1.0 < ABS(x)) {
        return 0.0;
      }
      pvVar3 = (this->data).
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      iVar9 = this->num_data_points;
      lVar7 = (long)((point + -5) * iVar9) * 8 +
              *(long *)&pvVar3[2].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data;
      lVar8 = *(long *)&(pvVar3->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                        super__Vector_impl_data;
      uVar5 = 0;
      if (iVar9 < 3) goto LAB_001c51c7;
      uVar6 = iVar9 - 1;
      do {
        uVar11 = (int)((int)uVar5 + uVar6) / 2;
        if (*(double *)(lVar8 + (long)(int)uVar11 * 8) <= dVar16) {
          uVar5 = (ulong)uVar11;
          uVar11 = uVar6;
        }
        uVar6 = uVar11;
        iVar14 = (int)uVar5;
      } while (1 < (int)(uVar6 - iVar14));
      goto LAB_001c503f;
    }
    iVar14 = 2 << ((byte)iVar14 & 0x1f);
    uVar6 = (int)(point - 1U) % iVar14;
    dVar16 = ldexp(1.0,iVar9);
    if ((int)uVar6 < 5) {
      dVar16 = dVar16 * (x + 1.0) + -1.0;
      if (1.0 < ABS(dVar16)) {
        return 0.0;
      }
      pvVar3 = (this->data).
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      iVar9 = this->num_data_points;
      lVar7 = (long)(int)(uVar6 * iVar9) * 8 +
              *(long *)&pvVar3[4].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data;
      lVar8 = *(long *)&(pvVar3->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                        super__Vector_impl_data;
      iVar14 = 0;
      uVar5 = 0;
      if (iVar9 < 3) goto LAB_001c51c7;
      iVar10 = iVar9 + -1;
      do {
        iVar12 = (iVar14 + iVar10) / 2;
        if (*(double *)(lVar8 + (long)iVar12 * 8) <= dVar16) {
          iVar14 = iVar12;
          iVar12 = iVar10;
        }
        iVar10 = iVar12;
      } while (1 < iVar10 - iVar14);
LAB_001c4e39:
      if (iVar14 == -1) {
        return 0.0;
      }
      if (0 < iVar14) {
        iVar10 = iVar9 + -3;
        if (iVar14 - iVar9 < -2) {
          iVar10 = iVar14;
        }
        uVar5 = (ulong)(iVar10 + -1);
        goto LAB_001c51c7;
      }
    }
    else {
      if (-6 < (int)(uVar6 - iVar14)) {
        dVar16 = dVar16 * (1.0 - x) + -1.0;
        if (1.0 < ABS(dVar16)) {
          return 0.0;
        }
        pvVar3 = (this->data).
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        iVar9 = this->num_data_points;
        lVar7 = (long)(int)((iVar14 + ~uVar6) * iVar9) * 8 +
                *(long *)&pvVar3[4].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data;
        lVar8 = *(long *)&(pvVar3->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                          super__Vector_impl_data;
        iVar14 = 0;
        uVar5 = 0;
        if (iVar9 < 3) goto LAB_001c51c7;
        iVar10 = iVar9 + -1;
        do {
          iVar12 = (iVar14 + iVar10) / 2;
          if (*(double *)(lVar8 + (long)iVar12 * 8) <= dVar16) {
            iVar14 = iVar12;
            iVar12 = iVar10;
          }
          iVar10 = iVar12;
        } while (1 < iVar10 - iVar14);
        goto LAB_001c4e39;
      }
      dVar16 = dVar16 * (x + 1.0) + -1.0 + (double)(int)(uVar6 - 5) * -0.125;
      if (1.0 < ABS(dVar16)) {
        return 0.0;
      }
      pvVar3 = (this->data).
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      iVar9 = this->num_data_points;
      lVar7 = (long)iVar9 * 0x28 +
              *(long *)&pvVar3[4].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data;
      lVar8 = *(long *)&(pvVar3->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                        super__Vector_impl_data;
      iVar14 = 0;
      uVar5 = 0;
      if (iVar9 < 3) goto LAB_001c51c7;
      iVar10 = iVar9 + -1;
      do {
        iVar13 = (iVar14 + iVar10) / 2;
        iVar12 = iVar13;
        if (*(double *)(lVar8 + (long)iVar13 * 8) <= dVar16) {
          iVar12 = iVar10;
          iVar14 = iVar13;
        }
        iVar10 = iVar12;
      } while (1 < iVar10 - iVar14);
      if (iVar14 == -1) {
        return 0.0;
      }
      if (0 < iVar14) {
        iVar10 = iVar9 + -3;
        if (iVar14 - iVar9 < -2) {
          iVar10 = iVar14;
        }
        uVar5 = (ulong)(iVar10 + -1);
        goto LAB_001c51c7;
      }
    }
  }
  uVar5 = 0;
LAB_001c51c7:
  pdVar1 = (double *)(lVar8 + uVar5 * 8);
  pdVar2 = (double *)(lVar7 + uVar5 * 8);
  dVar17 = dVar16 - *pdVar1;
  dVar18 = dVar16 - pdVar1[1];
  dVar15 = dVar16 - pdVar1[2];
  dVar16 = dVar16 - pdVar1[3];
  pdVar4 = (this->cachexs).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  return pdVar4[uVar5 * 4 + 3] * pdVar2[3] * dVar17 * dVar18 * dVar15 +
         pdVar4[uVar5 * 4 + 2] * pdVar2[2] * dVar17 * dVar18 * dVar16 +
         pdVar4[uVar5 * 4] * *pdVar2 * dVar18 * dVar15 * dVar16 +
         pdVar4[uVar5 * 4 + 1] * pdVar2[1] * dVar17 * dVar15 * dVar16;
}

Assistant:

inline double RuleWavelet::eval_cubic(int point, double x) const{
    // Helps stabilize numerical errors.
    if (point == 0 and x == 0.0 and mode == 1) return 0.0;

    // Evaluates a third order wavelet at a given point x.
    double sgn = 1.0;
    if (point < 5){ // Scaling functions
        if (point == 2){ // Reflect across y-axis
            point = 1;
            sgn = -1.0;
            x = -x;
        }else if(point == 4){
            point = 3;
            sgn = -1.0;
            x = -x;
        }
        const double *phi = &(data[1][((point+1)/2) * num_data_points]);
        return (mode == 0 ? interpolate<mode>(phi, x) : sgn * interpolate<mode>(phi, x));
    }
    int l = Maths::intlog2(point - 1);

    if(l == 2){
        if (point > 6){
            // i.e. 7 or 8
            // These wavelets are reflections across the y-axis of 6 & 5, respectively
            x = -x;
            sgn = -1.0;
            point = 13 - point;
        }
        point -= 5;
        const double *phi = &data[2][point*num_data_points];
        return (mode == 0 ? interpolate<mode>(phi, x) : sgn * interpolate<mode>(phi, x));
    }else if(l == 3){
        if (point > 12){
            // i.e. 13, 14, 15, 16
            // These wavelets are reflections of 12, 11, 10, 9, respectively
            x = -x;
            sgn = -1.0;
            point = 25 - point;
        }
        point -= 9;
        const double *phi = &data[3][point*num_data_points];
        return (mode == 0 ? interpolate<mode>(phi, x) : sgn * interpolate<mode>(phi, x));
    }
    // Standard lifted wavelets.
    int subindex = (point - 1) % (1 << l);
    double scale = pow(2,l-4);
    double value;
    if (subindex < 5){
        // Left boundary wavelet.
        value = interpolate<mode>(&data[4][subindex*num_data_points], scale * (x + 1.) - 1.);
    } else if ((1 << l) - 1 - subindex < 5){
        // Right boundary wavelet.
        value = interpolate<mode>(&data[4][((1 << l) - subindex - 1)*num_data_points], scale * (1. - x) - 1.);
    } else {
        // Central wavelets.
        double shift = 0.125 * (double (subindex - 5));
        value = interpolate<mode>(&data[4][5*num_data_points], scale * (x + 1.) -1. - shift);
    }
    // Adjust for the chain rule multiplier.
    if (mode == 1) value *= ((1 << l) - 1 - subindex < 5) ? -scale : scale;

    return value;
}